

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextRecord.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::TextRecord::TextRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (TextRecord *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  int MF_local;
  TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
  local_34 [12];
  
  MF_local = MF;
  record::Base<njoy::ENDFtk::record::Character<66>>::
  Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((Base<njoy::ENDFtk::record::Character<66>> *)this,it,end);
  record::
  TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
  ::
  TailVerification<int&,int&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,long&>
            (local_34,MAT,&MF_local,&MT,it,end,lineNumber);
  return;
}

Assistant:

TextRecord( Iterator& it, const Iterator& end, long& lineNumber,
                int MAT, int MF, int MT )
      try : base( it, end ) {

        tail( MAT, MF, MT, it, end, lineNumber );
      }
      catch ( std::exception& e ) {

        /* TODO error information here */
        throw e;
      }
      catch ( int fieldNo ) {

        --lineNumber;
        /* TODO error information here */
        throw std::exception();
      }